

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strscpy.c
# Opt level: O0

int run_test_strscpy(void)

{
  int iVar1;
  ssize_t sVar2;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char d [4];
  
  sVar2 = uv__strscpy((char *)((long)&eval_a + 4),"",0);
  if (sVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x20,"uv__strscpy(d, \"\", 0)","==","0",sVar2,"==",0);
    abort();
  }
  sVar2 = uv__strscpy((char *)((long)&eval_a + 4),"x",0);
  if (sVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x21,"uv__strscpy(d, \"x\", 0)","==","0",sVar2,"==",0);
    abort();
  }
  memset((void *)((long)&eval_a + 4),0,4);
  sVar2 = uv__strscpy((char *)((long)&eval_a + 4),"x",4);
  if (sVar2 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x24,"1","==","uv__strscpy(d, \"x\", sizeof(d))",1,"==",sVar2);
    abort();
  }
  iVar1 = memcmp((void *)((long)&eval_a + 4),"x",4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x25,"memcmp(d, \"x\\0\\0\", sizeof(d))","==","0",(long)iVar1,"==",0);
    abort();
  }
  memset((void *)((long)&eval_a + 4),0,4);
  sVar2 = uv__strscpy((char *)((long)&eval_a + 4),"xy",4);
  if (sVar2 != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x28,"2","==","uv__strscpy(d, \"xy\", sizeof(d))",2,"==",sVar2);
    abort();
  }
  iVar1 = memcmp((void *)((long)&eval_a + 4),"xy",4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x29,"memcmp(d, \"xy\\0\", sizeof(d))","==","0",(long)iVar1,"==",0);
    abort();
  }
  sVar2 = uv__strscpy((char *)((long)&eval_a + 4),"xyz",4);
  if (sVar2 != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x2b,"3","==","uv__strscpy(d, \"xyz\", sizeof(d))",3,"==",sVar2);
    abort();
  }
  iVar1 = memcmp((void *)((long)&eval_a + 4),"xyz",4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x2c,"memcmp(d, \"xyz\", sizeof(d))","==","0",(long)iVar1,"==",0);
    abort();
  }
  sVar2 = uv__strscpy((char *)((long)&eval_a + 4),"xyzz",4);
  if (sVar2 != -7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x2e,"UV_E2BIG","==","uv__strscpy(d, \"xyzz\", sizeof(d))",0xfffffffffffffff9,"==",
            sVar2);
    abort();
  }
  iVar1 = memcmp((void *)((long)&eval_a + 4),"xyz",4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x2f,"memcmp(d, \"xyz\", sizeof(d))","==","0",(long)iVar1,"==",0);
    abort();
  }
  sVar2 = uv__strscpy((char *)((long)&eval_a + 4),"xyzzy",4);
  if (sVar2 != -7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x31,"UV_E2BIG","==","uv__strscpy(d, \"xyzzy\", sizeof(d))",0xfffffffffffffff9,"==",
            sVar2);
    abort();
  }
  iVar1 = memcmp((void *)((long)&eval_a + 4),"xyz",4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-strscpy.c"
            ,0x32,"memcmp(d, \"xyz\", sizeof(d))","==","0",(long)iVar1,"==",0);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(strscpy) {
  char d[4];

  ASSERT_OK(uv__strscpy(d, "", 0));
  ASSERT_OK(uv__strscpy(d, "x", 0));

  memset(d, 0, sizeof(d));
  ASSERT_EQ(1, uv__strscpy(d, "x", sizeof(d)));
  ASSERT_OK(memcmp(d, "x\0\0", sizeof(d)));

  memset(d, 0, sizeof(d));
  ASSERT_EQ(2, uv__strscpy(d, "xy", sizeof(d)));
  ASSERT_OK(memcmp(d, "xy\0", sizeof(d)));

  ASSERT_EQ(3, uv__strscpy(d, "xyz", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  ASSERT_EQ(UV_E2BIG, uv__strscpy(d, "xyzz", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  ASSERT_EQ(UV_E2BIG, uv__strscpy(d, "xyzzy", sizeof(d)));
  ASSERT_OK(memcmp(d, "xyz", sizeof(d)));

  return 0;
}